

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

int secp256k1_scalar_reduce(secp256k1_scalar *r,uint overflow)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)overflow;
  uVar2 = r->d[0];
  r->d[0] = r->d[0] + uVar5 * 0x402da1732fc9bebf;
  puVar1 = r->d + 1;
  uVar3 = (ulong)CARRY8(uVar2,uVar5 * 0x402da1732fc9bebf);
  uVar2 = *puVar1;
  uVar4 = *puVar1 + uVar5 * 0x4551231950b75fc4;
  *puVar1 = uVar4 + uVar3;
  puVar1 = r->d + 2;
  uVar4 = (ulong)(CARRY8(uVar2,uVar5 * 0x4551231950b75fc4) || CARRY8(uVar4,uVar3));
  uVar2 = *puVar1;
  uVar3 = *puVar1;
  *puVar1 = uVar3 + uVar5 + uVar4;
  r->d[3] = r->d[3] + (ulong)(CARRY8(uVar2,uVar5) || CARRY8(uVar3 + uVar5,uVar4));
  return overflow;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_reduce(secp256k1_scalar *r, unsigned int overflow) {
    uint128_t t;
    VERIFY_CHECK(overflow <= 1);
    t = (uint128_t)r->d[0] + overflow * SECP256K1_N_C_0;
    r->d[0] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[1] + overflow * SECP256K1_N_C_1;
    r->d[1] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[2] + overflow * SECP256K1_N_C_2;
    r->d[2] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint64_t)r->d[3];
    r->d[3] = t & 0xFFFFFFFFFFFFFFFFULL;
    return overflow;
}